

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
kj::
ListIterator<kj::(anonymous_namespace)::AsyncTee::Branch,_kj::(anonymous_namespace)::AsyncTee::Branch,_&kj::(anonymous_namespace)::AsyncTee::Branch::link>
::ListIterator(ListIterator<kj::(anonymous_namespace)::AsyncTee::Branch,_kj::(anonymous_namespace)::AsyncTee::Branch,_&kj::(anonymous_namespace)::AsyncTee::Branch::link>
               *this,Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> *start)

{
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> *other;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> local_38 [2];
  Maybe<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>_> local_28;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> *local_18;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> *start_local;
  ListIterator<kj::(anonymous_namespace)::AsyncTee::Branch,_kj::(anonymous_namespace)::AsyncTee::Branch,_&kj::(anonymous_namespace)::AsyncTee::Branch::link>
  *this_local;
  
  local_18 = start;
  start_local = &this->current;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>::Maybe(&this->current,start);
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_list_h:217:24)>
            ((Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&> *)&local_28,
             (anon_class_1_0_00000001 *)start);
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>::Maybe(local_38);
  other = Maybe<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>_>::orDefault
                    (&local_28,local_38);
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>::Maybe(&this->next,other);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Branch_&>_>::~Maybe(&local_28);
  return;
}

Assistant:

explicit ListIterator(Maybe<MaybeConstT&> start)
      : current(start),
        next(start.map([](MaybeConstT& obj) -> kj::Maybe<MaybeConstT&> { return (obj.*link).next; })
            .orDefault(kj::none)) {}